

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPubkey::ExtPubkey
          (ExtPubkey *this,NetType network_type,Pubkey *parent_key,ByteData256 *parent_chain_code,
          uint8_t parent_depth,uint32_t child_num,Bip32FormatType format_type)

{
  uint8_t depth;
  ByteData256 *chain_code;
  ByteData256 *pubkey;
  uint32_t version;
  ByteData256 local_168;
  Extkey local_150;
  Extkey local_c0;
  uint32_t local_30;
  uint8_t local_29;
  uint32_t child_num_local;
  uint8_t parent_depth_local;
  ByteData256 *parent_chain_code_local;
  Pubkey *parent_key_local;
  ExtPubkey *pEStack_10;
  NetType network_type_local;
  ExtPubkey *this_local;
  
  local_30 = child_num;
  local_29 = parent_depth;
  _child_num_local = parent_chain_code;
  parent_chain_code_local = (ByteData256 *)parent_key;
  parent_key_local._4_4_ = network_type;
  pEStack_10 = this;
  version = ConvertToExtkeyVersion(network_type,format_type,false);
  pubkey = parent_chain_code_local;
  chain_code = _child_num_local;
  depth = local_29;
  ByteData256::ByteData256(&local_168);
  Extkey::FromPubkey(&local_150,version,(ByteData *)kEmptyFingerprint,(Pubkey *)pubkey,chain_code,
                     depth,0,&local_168);
  Extkey::Derive(&local_c0,&local_150,local_30);
  Extkey::Extkey(&this->super_Extkey,&local_c0);
  Extkey::~Extkey(&local_c0);
  Extkey::~Extkey(&local_150);
  ByteData256::~ByteData256(&local_168);
  return;
}

Assistant:

ExtPubkey::ExtPubkey(
    NetType network_type, const Pubkey& parent_key,
    const ByteData256& parent_chain_code, uint8_t parent_depth,
    uint32_t child_num, Bip32FormatType format_type)
    : Extkey(Extkey::FromPubkey(
                 ConvertToExtkeyVersion(network_type, format_type, false),
                 kEmptyFingerprint, parent_key, parent_chain_code,
                 parent_depth, 0)
                 .Derive(child_num)) {
  // do nothing
}